

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# z-util.c
# Opt level: O3

size_t utf32_to_utf8(char *out,size_t n_out,uint32_t *in,size_t n_in,size_t *pn_cnvt)

{
  uint uVar1;
  size_t sVar2;
  long lVar3;
  uint *puVar4;
  uint *puVar5;
  long lVar6;
  
  puVar4 = in;
  if (n_in == 0) {
    sVar2 = 0;
LAB_001fa3c5:
    puVar5 = puVar4;
    if (n_out == 0) goto LAB_001fa3ce;
  }
  else {
    puVar5 = in + n_in;
    lVar3 = n_in << 2;
    sVar2 = 0;
    do {
      uVar1 = *puVar4;
      if (uVar1 < 0x80) {
        if ((uVar1 == 0) || (n_out < 2)) goto LAB_001fa3c5;
        out[sVar2] = (char)uVar1;
        sVar2 = sVar2 + 1;
        lVar6 = -1;
      }
      else if (uVar1 < 0x800) {
        if (n_out < 3) goto LAB_001fa3c5;
        out[sVar2] = (byte)(uVar1 >> 6) | 0xc0;
        out[sVar2 + 1] = (byte)*puVar4 & 0x3f | 0x80;
        sVar2 = sVar2 + 2;
        lVar6 = -2;
      }
      else if (uVar1 < 0x10000) {
        if (((0xd7ff < uVar1) && (uVar1 < 0xe000)) || (n_out < 4)) goto LAB_001fa3c5;
        out[sVar2] = (byte)(uVar1 >> 0xc) | 0xe0;
        out[sVar2 + 1] = (byte)(*puVar4 >> 6) & 0x3f | 0x80;
        out[sVar2 + 2] = (byte)*puVar4 & 0x3f | 0x80;
        sVar2 = sVar2 + 3;
        lVar6 = -3;
      }
      else {
        if ((0x10ffff < uVar1) || (n_out < 5)) goto LAB_001fa3c5;
        out[sVar2] = (byte)(uVar1 >> 0x12) | 0xf0;
        out[sVar2 + 1] = (byte)(*puVar4 >> 0xc) & 0x3f | 0x80;
        out[sVar2 + 2] = (byte)(*puVar4 >> 6) & 0x3f | 0x80;
        out[sVar2 + 3] = (byte)*puVar4 & 0x3f | 0x80;
        sVar2 = sVar2 + 4;
        lVar6 = -4;
      }
      n_out = n_out + lVar6;
      puVar4 = puVar4 + 1;
      lVar3 = lVar3 + -4;
    } while (lVar3 != 0);
  }
  out[sVar2] = '\0';
LAB_001fa3ce:
  if (pn_cnvt != (size_t *)0x0) {
    *pn_cnvt = (long)puVar5 - (long)in >> 2;
  }
  return sVar2;
}

Assistant:

size_t utf32_to_utf8(char *out, size_t n_out, const uint32_t *in, size_t n_in,
	size_t *pn_cnvt)
{
	size_t nwritten = 0;
	const uint32_t *in_orig = in;
	const uint32_t *in_lim = in + n_in;

	while (1) {
		if (in == in_lim) {
			break;
		}
		if (*in <= 0x7f) {
			/* Encoded as single byte. */
			if (*in == 0) {
				break;
			}
			if (n_out <= 1) {
				break;
			}
			out[nwritten++] = (char) *in;
			--n_out;
		} else if (*in <= 0x7ff) {
			/* Encoded as two bytes. */
			if (n_out <= 2) {
				break;
			}
			out[nwritten++] = 0xc0 + ((*in & 0x7c0) >> 6);
			out[nwritten++] = 0x80 + (*in & 0x3f);
			n_out -= 2;
		} else if (*in <= 0xffff) {
			/* Encoded as three bytes. */
			if (*in >= 0xd800 && *in <= 0xdfff) {
				/*
				 * Those are reserved for UTF-16 surrogate
				 * pairs and should not be encoded.
				 */
				break;
			}
			if (n_out <= 3) {
				break;
			}
			out[nwritten++] = 0xe0 + ((*in & 0xf000) >> 12);
			out[nwritten++] = 0x80 + ((*in & 0xfc0) >> 6);
			out[nwritten++] = 0x80 + (*in & 0x3f);
			n_out -= 3;
		} else if (*in <= 0x10ffff) {
			/*
			 * Encoded as four bytes.  The upper limit of 0x10ffff
			 * is imposed by the limits of UTF-16.  Without that,
			 * the four byte encoding can handle values up to
			 * 0x1fffff.
			 */
			if (n_out <= 4) {
				break;
			}
			out[nwritten++] = 0xf0 + ((*in & 0x1c0000) >> 18);
			out[nwritten++] = 0x80 + ((*in & 0x3f000) >> 12);
			out[nwritten++] = 0x80 + ((*in & 0xfc0) >> 6);
			out[nwritten++] = 0x80 + (*in & 0x3f);
			n_out -= 4;
		} else {
			break;
		}
		++in;
	}
	if (n_out > 0) {
		out[nwritten] = 0;
	}
	if (pn_cnvt) {
		*pn_cnvt = in - in_orig;
	}
	return nwritten;
}